

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

int If_CutDsdBalancePinDelays_rec
              (If_DsdMan_t *p,int Id,int *pTimes,word *pRes,int *pnSupp,int nSuppAll,char *pPermLits
              )

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  word *pwVar13;
  undefined4 in_register_00000034;
  word wVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong in_R11;
  ulong uVar18;
  ulong uVar19;
  int pCounter [15];
  word pFaninRes [15];
  int local_e8 [12];
  ulong auStack_b8 [2];
  word local_a8;
  ulong local_a0 [14];
  
  if ((Id < 0) || ((p->vObjs).nSize <= Id)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  piVar2 = (int *)(p->vObjs).pArray[(uint)Id];
  uVar16 = piVar2[1];
  if (4 < (uVar16 & 7) - 2) {
    __assert_fail("If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x875,
                  "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                 );
  }
  uVar18 = (ulong)(uint)nSuppAll;
  switch(uVar16 & 7) {
  case 2:
    iVar6 = *pnSupp;
    *pnSupp = iVar6 + 1;
    bVar8 = pPermLits[iVar6];
    if ((char)bVar8 < '\0') {
LAB_00427a64:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (0x1f < bVar8) {
      __assert_fail("v >= 0 && v < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                    ,0x92,"word If_CutPinDelayInit(int)");
    }
    uVar16 = (uint)bVar8 * 2 & 0xfffffffc;
    *pRes = 1L << ((byte)uVar16 & 0x3f);
    iVar6 = *(int *)((long)pTimes + (ulong)uVar16);
    break;
  default:
    if (0x7ffffff < uVar16) {
      uVar16 = piVar2[2];
      if (uVar16 == 0) {
        iVar6 = 0;
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        uVar11 = 0;
        do {
          if ((int)uVar16 < 0) goto LAB_00427a64;
          iVar6 = If_CutDsdBalancePinDelays_rec
                            (p,uVar16 >> 1,pTimes,&local_a8 + uVar11,pnSupp,nSuppAll,pPermLits);
          uVar19 = (ulong)(int)uVar17;
          (&local_a8)[uVar19] = (&local_a8)[uVar11];
          uVar16 = uVar17 + 1;
          local_e8[uVar19] = iVar6;
          bVar4 = 0 < (int)uVar17;
          uVar17 = uVar16;
          if (bVar4) {
            do {
              uVar7 = uVar19 & 0xffffffff;
              iVar6 = local_e8[uVar7];
              uVar15 = uVar19 - 1 & 0xffffffff;
              iVar1 = local_e8[uVar15];
              if (iVar6 < iVar1) break;
              iVar5 = (int)uVar19;
              if (iVar1 < iVar6) {
                local_e8[uVar7] = iVar1;
                local_e8[uVar15] = iVar6;
                wVar14 = (&local_a8)[uVar7];
                (&local_a8)[uVar7] = (&local_a8)[uVar15];
                (&local_a8)[uVar15] = wVar14;
              }
              else {
                local_e8[uVar15] = iVar1 + 1;
                if (nSuppAll < 1) {
                  wVar14 = 0;
                }
                else {
                  if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00427a45;
                  lVar9 = 0;
                  wVar14 = 0;
                  do {
                    bVar8 = (byte)lVar9;
                    uVar12 = (uint)((&local_a8)[uVar7] >> (bVar8 & 0x3f)) & 0xf;
                    uVar16 = (uint)((&local_a8)[uVar15] >> (bVar8 & 0x3f)) & 0xf;
                    if (uVar16 < uVar12) {
                      uVar16 = uVar12;
                    }
                    if (uVar16 != 0) {
                      if (0xd < uVar16) {
                        uVar16 = 0xe;
                      }
                      wVar14 = wVar14 | (ulong)uVar16 + 1 << (bVar8 & 0x3f);
                    }
                    lVar9 = lVar9 + 4;
                  } while (uVar18 * 4 - lVar9 != 0);
                }
                (&local_a8)[uVar15] = wVar14;
                uVar17 = uVar17 - 1;
                if (iVar5 < (int)uVar17) {
                  lVar9 = 0;
                  do {
                    local_e8[uVar7 + lVar9] = local_e8[uVar7 + lVar9 + 1];
                    (&local_a8)[uVar7 + lVar9] = local_a0[uVar7 + lVar9];
                    lVar9 = lVar9 + 1;
                  } while ((int)lVar9 + iVar5 < (int)uVar17);
                }
              }
              uVar19 = uVar19 - 1;
            } while (1 < iVar5);
          }
          if ((int)uVar17 < 1) {
            __assert_fail("nTimes > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                          ,0xe2,
                          "int If_LogCounterPinDelays(int *, int *, word *, int, word, int, int)");
          }
          if ((ulong)((uint)piVar2[1] >> 0x1b) <= uVar11 + 1) {
            iVar6 = local_e8[0] + (uint)(uVar17 != 1);
            goto LAB_00427987;
          }
          uVar16 = piVar2[uVar11 + 3];
          uVar11 = uVar11 + 1;
        } while (uVar16 != 0);
        iVar6 = local_e8[0] + (uint)(uVar17 != 1);
      }
      if (uVar17 != 0) {
LAB_00427987:
        if (uVar17 != 1) {
          uVar11 = (ulong)uVar17;
          do {
            if (nSuppAll < 1) {
              uVar19 = 0;
            }
            else {
              if (nSuppAll - 0x11U < 0xfffffff0) goto LAB_00427a45;
              lVar9 = 0;
              uVar19 = 0;
              do {
                bVar8 = (byte)lVar9;
                uVar17 = (uint)(auStack_b8[uVar11 + 1] >> (bVar8 & 0x3f)) & 0xf;
                uVar16 = (uint)(auStack_b8[uVar11] >> (bVar8 & 0x3f)) & 0xf;
                if (uVar16 < uVar17) {
                  uVar16 = uVar17;
                }
                if (uVar16 != 0) {
                  if (0xd < uVar16) {
                    uVar16 = 0xe;
                  }
                  uVar19 = uVar19 | (ulong)uVar16 + 1 << (bVar8 & 0x3f);
                }
                lVar9 = lVar9 + 4;
              } while (uVar18 << 2 != lVar9);
            }
            auStack_b8[uVar11] = uVar19;
            bVar4 = 2 < (long)uVar11;
            uVar11 = uVar11 - 1;
          } while (bVar4);
        }
        *pRes = local_a8;
        return iVar6;
      }
    }
    __assert_fail("nCounter > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x880,
                  "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                 );
  case 5:
    uVar11 = CONCAT44(in_register_00000034,Id);
    if (0x7ffffff < uVar16) {
      pwVar13 = &local_a8;
      uVar19 = 0;
      do {
        uVar16 = piVar2[uVar19 + 2];
        uVar11 = local_a8;
        in_R11 = local_a0[0];
        if (uVar16 == 0) break;
        if ((int)uVar16 < 0) goto LAB_00427a64;
        iVar6 = If_CutDsdBalancePinDelays_rec
                          (p,uVar16 >> 1,pTimes,pwVar13,pnSupp,nSuppAll,pPermLits);
        local_e8[uVar19] = iVar6;
        uVar19 = uVar19 + 1;
        pwVar13 = pwVar13 + 1;
        uVar11 = local_a8;
        in_R11 = local_a0[0];
      } while (uVar19 < (uint)piVar2[1] >> 0x1b);
    }
    if (nSuppAll < 1) {
      wVar14 = 0;
    }
    else {
      if (nSuppAll - 0x11U < 0xfffffff0) {
LAB_00427a45:
        __assert_fail("v >= 0 && v < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifCount.h"
                      ,0x90,"int If_CutPinDelayGet(word, int)");
      }
      lVar9 = uVar18 << 2;
      lVar10 = 0;
      uVar18 = 0;
      do {
        bVar8 = (byte)lVar10;
        uVar17 = (uint)(uVar11 >> (bVar8 & 0x3f)) & 0xf;
        uVar16 = (uint)(in_R11 >> (bVar8 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          uVar18 = uVar18 | (ulong)uVar16 + 1 << (bVar8 & 0x3f);
        }
        lVar10 = lVar10 + 4;
      } while (lVar9 != lVar10);
      lVar10 = 0;
      uVar19 = 0;
      do {
        bVar8 = (byte)lVar10;
        uVar17 = (uint)(uVar11 >> (bVar8 & 0x3f)) & 0xf;
        uVar16 = (uint)(local_a0[1] >> (bVar8 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          uVar19 = uVar19 | (ulong)uVar16 + 1 << (bVar8 & 0x3f);
        }
        lVar10 = lVar10 + 4;
      } while (lVar9 != lVar10);
      lVar10 = 0;
      wVar14 = 0;
      do {
        bVar8 = (byte)lVar10;
        uVar17 = (uint)(uVar18 >> (bVar8 & 0x3f)) & 0xf;
        uVar16 = (uint)(uVar19 >> (bVar8 & 0x3f)) & 0xf;
        if (uVar16 < uVar17) {
          uVar16 = uVar17;
        }
        if (uVar16 != 0) {
          if (0xd < uVar16) {
            uVar16 = 0xe;
          }
          wVar14 = wVar14 | (ulong)uVar16 + 1 << (bVar8 & 0x3f);
        }
        lVar10 = lVar10 + 4;
      } while (lVar9 != lVar10);
    }
    *pRes = wVar14;
    if (local_e8[2] < local_e8[1]) {
      local_e8[2] = local_e8[1];
    }
    if (local_e8[2] < local_e8[0]) {
      local_e8[2] = local_e8[0];
    }
    iVar6 = local_e8[2] + 2;
    break;
  case 6:
    if (0x17ffffff < uVar16) {
      iVar6 = *piVar2;
      if (((long)iVar6 < 0) || ((p->vTruths).nSize <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p->vTruths).pArray[iVar6];
      lVar9 = (long)iVar6;
      if ((-1 < lVar9) && (iVar6 < p->vIsops[uVar16 >> 0x1b]->nSize)) {
        pVVar3 = p->vIsops[uVar16 >> 0x1b]->pArray;
        if (pVVar3[lVar9].nSize < 1) {
          __assert_fail("Vec_IntSize(vCover) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x870,
                        "int If_CutDsdBalancePinDelays_rec(If_DsdMan_t *, int, int *, word *, int *, int, char *)"
                       );
        }
        pwVar13 = &local_a8;
        uVar18 = 0;
        do {
          uVar16 = piVar2[uVar18 + 2];
          if (uVar16 == 0) break;
          if ((int)uVar16 < 0) goto LAB_00427a64;
          iVar6 = If_CutDsdBalancePinDelays_rec
                            (p,uVar16 >> 1,pTimes,pwVar13,pnSupp,nSuppAll,pPermLits);
          local_e8[uVar18] = iVar6;
          uVar18 = uVar18 + 1;
          pwVar13 = pwVar13 + 1;
        } while (uVar18 < (uint)piVar2[1] >> 0x1b);
        iVar6 = If_CutSopBalancePinDelaysInt(pVVar3 + lVar9,local_e8,&local_a8,nSuppAll,pRes);
        return iVar6;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  return iVar6;
}

Assistant:

int If_CutDsdBalancePinDelays_rec( If_DsdMan_t * p, int Id, int * pTimes, word * pRes, int * pnSupp, int nSuppAll, char * pPermLits )
{
    If_DsdObj_t * pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
    {
        int iCutVar = Abc_Lit2Var(pPermLits[(*pnSupp)++]);
        *pRes = If_CutPinDelayInit(iCutVar);
        return pTimes[iCutVar];
    }
    if ( If_DsdObjType(pObj) == IF_DSD_MUX )
    {
        word pFaninRes[3], Res0, Res1;
        int i, iFanin, Delays[3];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        Res0 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[1], nSuppAll, 1 );
        Res1 = If_CutPinDelayMax( pFaninRes[0], pFaninRes[2], nSuppAll, 1 );
        *pRes = If_CutPinDelayMax( Res0, Res1, nSuppAll, 1 );
        return 2 + Abc_MaxInt(Delays[0], Abc_MaxInt(Delays[1], Delays[2]));
    }
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delays[IF_MAX_FUNC_LUTSIZE];
        Vec_Int_t * vCover = Vec_WecEntry( p->vIsops[pObj->nFans], If_DsdObjTruthId(p, pObj) );
        assert( Vec_IntSize(vCover) > 0 );
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
            Delays[i] = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
        return If_CutSopBalancePinDelaysInt( vCover, Delays, pFaninRes, nSuppAll, pRes );
    }
    assert( If_DsdObjType(pObj) == IF_DSD_AND || If_DsdObjType(pObj) == IF_DSD_XOR );
    {
        word pFaninRes[IF_MAX_FUNC_LUTSIZE];
        int i, iFanin, Delay, Result = 0;
        int fXor = 0;//(If_DsdObjType(pObj) == IF_DSD_XOR);
        int nCounter = 0, pCounter[IF_MAX_FUNC_LUTSIZE];
        If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        {
            Delay = If_CutDsdBalancePinDelays_rec( p, Abc_Lit2Var(iFanin), pTimes, pFaninRes+i, pnSupp, nSuppAll, pPermLits );
            Result = If_LogCounterPinDelays( pCounter, &nCounter, pFaninRes, Delay, pFaninRes[i], nSuppAll, fXor );
        }
        assert( nCounter > 0 );
        if ( fXor )
            Result = If_LogCounterDelayXor( pCounter, nCounter ); // estimation
        *pRes = If_LogPinDelaysMulti( pFaninRes, nCounter, nSuppAll, fXor );
        return Result;
    }
}